

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_16_frc_di(void)

{
  uint uVar1;
  uint uVar2;
  
  if ((m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
    uVar2 = m68ki_read_imm_16();
    m68ki_write_16_fc(uVar1 + (int)(short)uVar2,m68ki_cpu.s_flag | 1,
                      (m68ki_cpu.x_flag & 0x100 | m68ki_cpu.n_flag & 0x80) >> 4 |
                      (uint)((m68ki_cpu.not_z_flag != 0 ^ 0xffU) & 1) << 2 |
                      (m68ki_cpu.v_flag & 0x80) >> 6 | (m68ki_cpu.c_flag & 0x100) >> 8);
  }
  return;
}

Assistant:

static void m68k_op_move_16_frc_di(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		m68ki_write_16(EA_AY_DI_16(), m68ki_get_ccr());
		return;
	}
	m68ki_exception_illegal();
}